

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::mouseReleaseEvent(QAbstractItemView *this,QMouseEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  undefined4 uVar7;
  ulong uVar8;
  QStyle *pQVar9;
  int iVar10;
  QObject *pQVar11;
  long in_FS_OFFSET;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  QPersistentModelIndex index;
  QStyleOptionViewItem option;
  QPersistentModelIndex local_158;
  undefined8 local_150;
  undefined1 local_148 [88];
  QFont local_f0 [24];
  QLocale local_d8 [6];
  QIcon local_a8;
  QArrayData *local_a0;
  QBrush local_80 [8];
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  bVar5 = this_00->releaseFromDoubleClick;
  this_00->releaseFromDoubleClick = false;
  auVar14 = QEventPoint::position();
  dVar13 = (double)((ulong)auVar14._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar14._0_8_;
  bVar3 = 2147483647.0 < dVar13;
  if (dVar13 <= -2147483648.0) {
    dVar13 = -2147483648.0;
  }
  dVar12 = (double)((ulong)auVar14._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar14._8_8_;
  bVar4 = 2147483647.0 < dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar12 = -2147483648.0;
  }
  local_150 = CONCAT44((int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                    ~-(ulong)bVar4 & (ulong)dVar12),
                       (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                    ~-(ulong)bVar3 & (ulong)dVar13));
  local_158.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)this + 0x1f0))((QModelIndex *)local_148,this);
  QPersistentModelIndex::QPersistentModelIndex(&local_158,(QModelIndex *)local_148);
  if (*(int *)(*(long *)(this + 8) + 0x3a8) == 3) {
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
    if (((-1 < (int)local_148._0_4_) && (-1 < (int)local_148._4_4_)) &&
       ((QAbstractItemModel *)local_148._16_8_ == this_00->model)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_158);
      uVar8 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_58);
      if ((uVar8 & 0x20) != 0) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_158);
        bVar5 = QAbstractItemViewPrivate::sendDelegateEvent(this_00,&local_78,(QEvent *)event);
        if (bVar5) {
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
          update(this,(QModelIndex *)local_148);
        }
      }
    }
    goto LAB_0053392c;
  }
  cVar6 = comparesEqual(&local_158,&this_00->pressedIndex);
  if (cVar6 == '\0') {
LAB_005336ec:
    bVar5 = false;
LAB_005336ee:
    cVar6 = '\0';
  }
  else {
    cVar6 = QPersistentModelIndex::isValid();
    if ((cVar6 == '\0') || (bVar5 != false)) goto LAB_005336ec;
    iVar10 = 0;
    if ((this_00->pressedAlreadySelected == true) && (iVar10 = 0, *(int *)(event + 0x40) == 1)) {
      iVar10 = (uint)(*(int *)(event + 0x20) == 0) << 2;
    }
    bVar5 = true;
    if (this_00->pressClosedEditor != false) goto LAB_005336ee;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
    cVar6 = (**(code **)(*(long *)this + 0x2e0))(this,local_148,iVar10,event);
  }
  this_00->ctrlDragSelectionFlag = NoUpdate;
  pDVar1 = (this_00->selectionModel).wp.d;
  if ((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
      (pQVar11 = (this_00->selectionModel).wp.value, pQVar11 != (QObject *)0x0)) &&
     ((this_00->noSelectionOnMousePress == true &&
      (this_00->noSelectionOnMousePress = false, this_00->pressClosedEditor == false)))) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar11 = (QObject *)0x0;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_158);
    uVar7 = (**(code **)(*(long *)this + 0x2e8))(this,&local_58,event);
    (**(code **)(*(long *)pQVar11 + 0x68))(pQVar11,local_148,uVar7);
  }
  this_00->pressClosedEditor = false;
  *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 0;
  if (bVar5) {
    if (*(int *)(event + 0x40) == 1) {
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
      local_58.r = 0;
      local_58.c = 0;
      local_58.i = (quintptr)local_148;
      QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_58);
    }
    if (cVar6 == '\0') {
      memset((QStyleOptionViewItem *)local_148,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)local_148);
      (**(code **)(*(long *)this + 0x2f8))(this,(QStyleOptionViewItem *)local_148);
      if (this_00->pressedAlreadySelected == true) {
        local_148[9] = local_148[9] | 0x80;
      }
      pQVar2 = this_00->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_158);
      uVar8 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,&local_58);
      if ((uVar8 & 0x20) != 0) {
        pQVar9 = QWidget::style((QWidget *)this);
        iVar10 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x3d,local_148,this,0);
        if (iVar10 != 0) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_158);
          local_78.r = 0;
          local_78.c = 0;
          local_78.i = (quintptr)&local_58;
          QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)&local_78);
        }
      }
      QBrush::~QBrush(local_80);
      if (local_a0 != (QArrayData *)0x0) {
        LOCK();
        (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a0,2,0x10);
        }
      }
      QIcon::~QIcon(&local_a8);
      QLocale::~QLocale(local_d8);
      QFont::~QFont(local_f0);
      QStyleOption::~QStyleOption((QStyleOption *)local_148);
    }
  }
LAB_0053392c:
  QPersistentModelIndex::~QPersistentModelIndex(&local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    const bool releaseFromDoubleClick = d->releaseFromDoubleClick;
    d->releaseFromDoubleClick = false;

    QPoint pos = event->position().toPoint();
    QPersistentModelIndex index = indexAt(pos);

    if (state() == EditingState) {
        if (d->isIndexValid(index)
            && d->isIndexEnabled(index)
            && d->sendDelegateEvent(index, event))
            update(index);
        return;
    }

    bool click = (index == d->pressedIndex && index.isValid() && !releaseFromDoubleClick);
    bool selectedClicked = click && d->pressedAlreadySelected
                        && (event->button() == Qt::LeftButton)
                        && (event->modifiers() == Qt::NoModifier);
    EditTrigger trigger = (selectedClicked ? SelectedClicked : NoEditTriggers);
    const bool edited = click && !d->pressClosedEditor ? edit(index, trigger, event) : false;

    d->ctrlDragSelectionFlag = QItemSelectionModel::NoUpdate;

    if (d->selectionModel && d->noSelectionOnMousePress) {
        d->noSelectionOnMousePress = false;
        if (!d->pressClosedEditor)
            d->selectionModel->select(index, selectionCommand(index, event));
    }

    d->pressClosedEditor = false;
    setState(NoState);

    if (click) {
        if (event->button() == Qt::LeftButton)
            emit clicked(index);
        if (edited)
            return;
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        if (d->pressedAlreadySelected)
            option.state |= QStyle::State_Selected;
        if ((d->model->flags(index) & Qt::ItemIsEnabled)
            && style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, &option, this))
            emit activated(index);
    }
}